

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O0

apx_error_t
apx_clientTestConnection_transmit_direct_message
          (apx_clientTestConnection_t *self,uint8_t *msg_data,int32_t msg_size,
          int32_t *bytes_available)

{
  uint uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  apx_size_t buffer_available;
  apx_size_t bytes_to_send;
  apx_size_t header_size;
  uint8_t header [4];
  int32_t *bytes_available_local;
  int32_t msg_size_local;
  uint8_t *msg_data_local;
  apx_clientTestConnection_t *self_local;
  
  if ((int)self->default_buffer_size < msg_size) {
    self_local._4_4_ = 0x21;
  }
  else {
    _header_size = bytes_available;
    uVar1 = numheader_encode32((uint8_t *)&bytes_to_send,4,msg_size);
    uVar2 = adt_bytearray_length(&self->transmit_buffer);
    if ((uVar2 - self->pending_bytes < uVar1 + msg_size) &&
       (send_packet(self), self->pending_bytes != 0)) {
      __assert_fail("self->pending_bytes == 0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_test_connection.c"
                    ,0x1ef,
                    "apx_error_t apx_clientTestConnection_transmit_direct_message(apx_clientTestConnection_t *, const uint8_t *, int32_t, int32_t *)"
                   );
    }
    puVar3 = adt_bytearray_data(&self->transmit_buffer);
    memcpy(puVar3,&bytes_to_send,(ulong)uVar1);
    self->pending_bytes = uVar1 + self->pending_bytes;
    puVar3 = adt_bytearray_data(&self->transmit_buffer);
    memcpy(puVar3 + self->pending_bytes,msg_data,(long)msg_size);
    self->pending_bytes = msg_size + self->pending_bytes;
    uVar2 = adt_bytearray_length(&self->transmit_buffer);
    *_header_size = uVar2 - self->pending_bytes;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t apx_clientTestConnection_transmit_direct_message(apx_clientTestConnection_t* self, uint8_t const* msg_data, int32_t msg_size, int32_t* bytes_available)
{
   uint8_t  header [NUMHEADER32_LONG_SIZE];
   if (msg_size > ((int32_t)self->default_buffer_size))
   {
      return APX_MSG_TOO_LARGE_ERROR;
   }
   apx_size_t const header_size = numheader_encode32(header, sizeof(header), msg_size);
   apx_size_t const bytes_to_send = header_size + msg_size;
   apx_size_t const buffer_available = ((apx_size_t)adt_bytearray_length(&self->transmit_buffer)) - self->pending_bytes;
   if (bytes_to_send > buffer_available)
   {
      send_packet(self);
      assert(self->pending_bytes == 0u);
   }
   memcpy(adt_bytearray_data(&self->transmit_buffer), header, header_size);
   self->pending_bytes += header_size;
   memcpy(adt_bytearray_data(&self->transmit_buffer) + self->pending_bytes, msg_data, msg_size);
   self->pending_bytes += msg_size;
   *bytes_available = (int32_t)(((apx_size_t)adt_bytearray_length(&self->transmit_buffer)) - self->pending_bytes);
   return APX_NO_ERROR;
}